

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculationvisitor.cpp
# Opt level: O2

void __thiscall
CalculationVisitor::defineVariable
          (CalculationVisitor *this,BinaryOperatorExpression *expression,
          VariableExpression *variable)

{
  Environment *this_00;
  ResultValue value_00;
  Expression *pEVar1;
  ResultValue value;
  string local_70;
  ResultValue local_50;
  
  pEVar1 = BinaryOperatorExpression::rightHandSide(expression);
  (*pEVar1->_vptr_Expression[2])(pEVar1,this,expression);
  popStack(&local_50,this);
  this_00 = this->mEnvironment;
  VariableExpression::name_abi_cxx11_(&local_70,variable);
  value_00.mIntValue = local_50.mIntValue;
  value_00.mType = local_50.mType;
  value_00._4_4_ = local_50._4_4_;
  value_00.mFloatValue = local_50.mFloatValue;
  value_00.mComplexValue._M_value._0_8_ = local_50.mComplexValue._M_value._0_8_;
  value_00.mComplexValue._M_value._8_8_ = local_50.mComplexValue._M_value._8_8_;
  Environment::set(this_00,&local_70,value_00);
  std::__cxx11::string::~string((string *)&local_70);
  std::deque<ResultValue,_std::allocator<ResultValue>_>::push_back
            (&(this->mEvaluationStack).c,&local_50);
  return;
}

Assistant:

void CalculationVisitor::defineVariable(BinaryOperatorExpression* expression, VariableExpression* variable) {
	expression->rightHandSide()->accept(*this, expression);

	auto value = popStack();
	mEnvironment.set(variable->name(), value);
	mEvaluationStack.push(value);
}